

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

int __thiscall rw::Engine::init(Engine *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if ((engine == 0) && (state == 0)) {
    totalMemoryAllocated = 0;
    allocations = &allocations;
    _DAT_0014af08 = &allocations;
    if (this == (Engine *)0x0) {
      DAT_0014adb0 = (code *)defaultMemfuncs._32_8_;
      DAT_0014ada0 = (LLLink *)defaultMemfuncs._16_8_;
      DAT_0014ada8 = (code *)defaultMemfuncs._24_8_;
      memfuncs._0_4_ = defaultMemfuncs._0_4_;
      memfuncs._4_4_ = defaultMemfuncs._4_4_;
      DAT_0014ad98._0_4_ = defaultMemfuncs._8_4_;
      DAT_0014ad98._4_4_ = defaultMemfuncs._12_4_;
    }
    else {
      DAT_0014adb0 = (this->filefuncs).rwfopen;
      DAT_0014ada0 = (this->frameDirtyList).link.next;
      DAT_0014ada8 = (code *)(this->frameDirtyList).link.prev;
      memfuncs._0_4_ = *(undefined4 *)&this->currentCamera;
      memfuncs._4_4_ = *(undefined4 *)((long)&this->currentCamera + 4);
      DAT_0014ad98._0_4_ = *(undefined4 *)&this->currentWorld;
      DAT_0014ad98._4_4_ = *(undefined4 *)((long)&this->currentWorld + 4);
    }
    if ((LLLink *)DAT_0014ada8 == (LLLink *)0x0) {
      DAT_0014ada8 = mustmalloc_h;
    }
    if (DAT_0014adb0 == (_func_void_ptr_char_ptr_char_ptr *)0x0) {
      DAT_0014adb0 = mustrealloc_h;
    }
    PluginList::open((char *)this,(int)ctx);
    puVar2 = &DAT_0014adc8;
    lVar3 = 0xd;
    do {
      puVar2[-1] = 0x5800000058;
      *puVar2 = puVar2;
      puVar2[1] = puVar2;
      puVar2 = puVar2 + 3;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    Frame::registerModule();
    Image::registerModule();
    Raster::registerModule();
    Texture::registerModule();
    Frame::numAllocated = 0;
    Image::numAllocated = 0;
    Raster::numAllocated = 0;
    Texture::numAllocated = 0;
    TexDictionary::numAllocated = 0;
    Geometry::numAllocated = 0;
    Material::numAllocated = 0;
    Atomic::numAllocated = 0;
    Light::numAllocated = 0;
    Camera::numAllocated = 0;
    Clump::numAllocated = 0;
    World::numAllocated = 0;
    ps2::registerPlatformPlugins();
    xbox::registerPlatformPlugins();
    d3d8::registerPlatformPlugins();
    d3d9::registerPlatformPlugins();
    wdgl::registerPlatformPlugins();
    gl3::registerPlatformPlugins();
    state = 1;
    iVar1 = 1;
  }
  else {
    init((EVP_PKEY_CTX *)this);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

bool32
Engine::init(MemoryFunctions *memfuncs)
{
	if(engine || Engine::state != Dead){
		RWERROR((ERR_ENGINEINIT));
		return 0;
	}

	totalMemoryAllocated = 0;
	allocations.init();

	if(memfuncs)
		Engine::memfuncs = *memfuncs;
	else
		Engine::memfuncs = defaultMemfuncs;

	if(Engine::memfuncs.rwmustmalloc == nil)
		Engine::memfuncs.rwmustmalloc = mustmalloc_h;
	if(Engine::memfuncs.rwmustrealloc == nil)
		Engine::memfuncs.rwmustrealloc = mustrealloc_h;

	PluginList::open();

	for(uint i = 0; i < NUM_PLATFORMS; i++)
		new (&Driver::s_plglist[i]) PluginList(sizeof(Driver));

	// core plugin attach here
	Frame::registerModule();
	Image::registerModule();
	Raster::registerModule();
	Texture::registerModule();

	// TODO: reset all allocation counts here. or maybe do that in modules?
	Frame::numAllocated = 0;
	Image::numAllocated = 0;
	Raster::numAllocated = 0;
	Texture::numAllocated = 0;
	TexDictionary::numAllocated = 0;
	Geometry::numAllocated = 0;
	Material::numAllocated = 0;
	Atomic::numAllocated = 0;
	Light::numAllocated = 0;
	Camera::numAllocated = 0;
	Clump::numAllocated = 0;
	World::numAllocated = 0;

	// driver plugin attach
	ps2::registerPlatformPlugins();
	xbox::registerPlatformPlugins();
	d3d8::registerPlatformPlugins();
	d3d9::registerPlatformPlugins();
	wdgl::registerPlatformPlugins();
	gl3::registerPlatformPlugins();

	Engine::state = Initialized;
	return 1;
}